

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O2

void reverse_sequence_iterator_kvs_test(void)

{
  void *pvVar1;
  void *pvVar2;
  fdb_status fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  fdb_doc **ppfVar11;
  fdb_doc *pfVar12;
  long lVar13;
  char *__format;
  long lVar14;
  fdb_doc *pfVar15;
  long *plVar16;
  bool bVar17;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_iterator *iterator2;
  fdb_kvs_handle *kv1;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *kv2;
  fdb_doc *local_4f8 [6];
  long local_4c8 [4];
  fdb_doc *apfStack_4a8 [11];
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char keybuf [256];
  char bodybuf [256];
  char metabuf [256];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = (fdb_doc *)0x0;
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.seqtree_opt = '\x01';
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fdb_open(&dbfile,"./iterator_test1",&fconfig);
  fdb_kvs_open_default(dbfile,&kv1,&kvs_config);
  fVar3 = fdb_set_log_callback(kv1,logCallbackFunc,"reverse_sequence_iterator_kvs_test");
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xa60);
    reverse_sequence_iterator_kvs_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xa60,"void reverse_sequence_iterator_kvs_test()");
  }
  fVar3 = fdb_kvs_open(dbfile,&kv2,"kv2",&kvs_config);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xa64);
    reverse_sequence_iterator_kvs_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xa64,"void reverse_sequence_iterator_kvs_test()");
  }
  lVar14 = 0;
  uVar10 = 0;
  while (uVar10 != 10) {
    sprintf(keybuf,"kEy%d",uVar10 & 0xffffffff);
    sprintf(metabuf,"mEta%d",uVar10 & 0xffffffff);
    sprintf(bodybuf,"bOdy%d",uVar10 & 0xffffffff);
    sVar7 = strlen(keybuf);
    sVar8 = strlen(metabuf);
    sVar9 = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)apfStack_4a8 + lVar14),keybuf,sVar7,metabuf,sVar8,bodybuf,
                   sVar9);
    fVar3 = fdb_set(kv2,apfStack_4a8[uVar10]);
    uVar10 = uVar10 + 1;
    lVar14 = lVar14 + 8;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xa6e);
      reverse_sequence_iterator_kvs_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xa6e,"void reverse_sequence_iterator_kvs_test()");
    }
  }
  ppfVar11 = local_4f8;
  for (uVar10 = 0; uVar10 < 10; uVar10 = uVar10 + 2) {
    sprintf(keybuf,"key%d",uVar10 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar10 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar10 & 0xffffffff);
    sVar7 = strlen(keybuf);
    sVar8 = strlen(metabuf);
    sVar9 = strlen(bodybuf);
    fdb_doc_create(ppfVar11,keybuf,sVar7,metabuf,sVar8,bodybuf,sVar9);
    fdb_set(kv1,*ppfVar11);
    ppfVar11 = ppfVar11 + 2;
  }
  fdb_commit(dbfile,'\x01');
  ppfVar11 = local_4f8 + 1;
  for (uVar10 = 1; uVar10 < 10; uVar10 = uVar10 + 2) {
    sprintf(keybuf,"key%d",uVar10 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar10 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar10 & 0xffffffff);
    sVar7 = strlen(keybuf);
    sVar8 = strlen(metabuf);
    sVar9 = strlen(bodybuf);
    fdb_doc_create(ppfVar11,keybuf,sVar7,metabuf,sVar8,bodybuf,sVar9);
    fdb_set(kv1,*ppfVar11);
    ppfVar11 = ppfVar11 + 2;
  }
  fdb_commit(dbfile,'\0');
  fVar3 = fdb_iterator_sequence_init(kv1,&iterator,0,0,0);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xa8c);
    reverse_sequence_iterator_kvs_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xa8c,"void reverse_sequence_iterator_kvs_test()");
  }
  lVar14 = 0;
  do {
    fdb_iterator_get(iterator,&rdoc);
    pfVar15 = rdoc;
    lVar13 = *(long *)((long)local_4f8 + lVar14);
    iVar4 = bcmp(rdoc->key,*(void **)(lVar13 + 0x20),rdoc->keylen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
             );
      pfVar15 = rdoc;
      reverse_sequence_iterator_kvs_test()::__test_pass = '\x01';
      lVar13 = *(long *)((long)local_4f8 + lVar14);
      iVar4 = bcmp(rdoc->key,*(void **)(lVar13 + 0x20),rdoc->keylen);
      if (iVar4 != 0) {
        __assert_fail("!memcmp(rdoc->key, doc[i]->key, rdoc->keylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xa92,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    iVar4 = bcmp(pfVar15->meta,*(void **)(lVar13 + 0x38),pfVar15->metalen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
             );
      pfVar15 = rdoc;
      reverse_sequence_iterator_kvs_test()::__test_pass = '\x01';
      lVar13 = *(long *)((long)local_4f8 + lVar14);
      iVar4 = bcmp(rdoc->meta,*(void **)(lVar13 + 0x38),rdoc->metalen);
      if (iVar4 != 0) {
        __assert_fail("!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xa93,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    iVar4 = bcmp(pfVar15->body,*(void **)(lVar13 + 0x40),pfVar15->bodylen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
             );
      pfVar15 = rdoc;
      reverse_sequence_iterator_kvs_test()::__test_pass = '\x01';
      iVar4 = bcmp(rdoc->body,*(void **)(*(long *)((long)local_4f8 + lVar14) + 0x40),rdoc->bodylen);
      if (iVar4 != 0) {
        __assert_fail("!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xa94,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    fdb_doc_free(pfVar15);
    rdoc = (fdb_doc *)0x0;
    if ((int)lVar14 == 0x40) goto LAB_00111441;
    fVar3 = fdb_iterator_next(iterator);
    lVar14 = lVar14 + 0x10;
  } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
  if ((int)lVar14 != 0x50) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xa9f);
    reverse_sequence_iterator_kvs_test()::__test_pass = 1;
    __assert_fail("count==n/2",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xa9f,"void reverse_sequence_iterator_kvs_test()");
  }
LAB_00111441:
  fVar3 = fdb_iterator_sequence_init(kv2,&iterator2,0,0,0);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xaa3);
    reverse_sequence_iterator_kvs_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xaa3,"void reverse_sequence_iterator_kvs_test()");
  }
  do {
    fVar3 = fdb_iterator_get(iterator2,&rdoc);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xaa6);
      reverse_sequence_iterator_kvs_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xaa6,"void reverse_sequence_iterator_kvs_test()");
    }
    fdb_doc_free(rdoc);
    rdoc = (fdb_doc *)0x0;
    fVar3 = fdb_iterator_next(iterator2);
  } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
  fdb_commit(dbfile,'\x01');
  iVar4 = 4;
  plVar16 = local_4c8;
  while( true ) {
    fVar3 = fdb_iterator_prev(iterator);
    if (fVar3 == FDB_RESULT_ITERATOR_FAIL) break;
    fVar3 = fdb_iterator_get(iterator,&rdoc);
    pfVar15 = rdoc;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xabc);
      reverse_sequence_iterator_kvs_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xabc,"void reverse_sequence_iterator_kvs_test()");
    }
    lVar14 = *plVar16;
    iVar5 = bcmp(rdoc->key,*(void **)(lVar14 + 0x20),rdoc->keylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
             );
      pfVar15 = rdoc;
      reverse_sequence_iterator_kvs_test()::__test_pass = '\x01';
      lVar14 = *plVar16;
      iVar5 = bcmp(rdoc->key,*(void **)(lVar14 + 0x20),rdoc->keylen);
      if (iVar5 != 0) {
        __assert_fail("!memcmp(rdoc->key, doc[i]->key, rdoc->keylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xabd,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    iVar5 = bcmp(pfVar15->meta,*(void **)(lVar14 + 0x38),pfVar15->metalen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
             );
      pfVar15 = rdoc;
      reverse_sequence_iterator_kvs_test()::__test_pass = '\x01';
      lVar14 = *plVar16;
      iVar5 = bcmp(rdoc->meta,*(void **)(lVar14 + 0x38),rdoc->metalen);
      if (iVar5 != 0) {
        __assert_fail("!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xabe,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    iVar5 = bcmp(pfVar15->body,*(void **)(lVar14 + 0x40),pfVar15->bodylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
             );
      pfVar15 = rdoc;
      reverse_sequence_iterator_kvs_test()::__test_pass = '\x01';
      iVar5 = bcmp(rdoc->body,*(void **)(*plVar16 + 0x40),rdoc->bodylen);
      if (iVar5 != 0) {
        __assert_fail("!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xabf,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    fdb_doc_free(pfVar15);
    rdoc = (fdb_doc *)0x0;
    plVar16 = plVar16 + -2;
    iVar4 = iVar4 + -1;
  }
  if (iVar4 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xac6);
    reverse_sequence_iterator_kvs_test()::__test_pass = 1;
    __assert_fail("count==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xac6,"void reverse_sequence_iterator_kvs_test()");
  }
  fdb_iterator_close(iterator);
  lVar14 = 9;
  while( true ) {
    fVar3 = fdb_iterator_prev(iterator2);
    if (fVar3 == FDB_RESULT_ITERATOR_FAIL) break;
    fVar3 = fdb_iterator_get(iterator2,&rdoc);
    pfVar15 = rdoc;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xad2);
      reverse_sequence_iterator_kvs_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xad2,"void reverse_sequence_iterator_kvs_test()");
    }
    pfVar12 = apfStack_4a8[lVar14];
    iVar4 = bcmp(rdoc->key,pfVar12->key,rdoc->keylen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
             );
      pfVar15 = rdoc;
      reverse_sequence_iterator_kvs_test()::__test_pass = '\x01';
      pfVar12 = apfStack_4a8[lVar14];
      iVar4 = bcmp(rdoc->key,pfVar12->key,rdoc->keylen);
      if (iVar4 != 0) {
        __assert_fail("!memcmp(rdoc->key, doc2[i]->key, rdoc->keylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xad3,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    iVar4 = bcmp(pfVar15->meta,pfVar12->meta,pfVar15->metalen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
             );
      pfVar15 = rdoc;
      reverse_sequence_iterator_kvs_test()::__test_pass = '\x01';
      pfVar12 = apfStack_4a8[lVar14];
      iVar4 = bcmp(rdoc->meta,pfVar12->meta,rdoc->metalen);
      if (iVar4 != 0) {
        __assert_fail("!memcmp(rdoc->meta, doc2[i]->meta, rdoc->metalen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xad4,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    iVar4 = bcmp(pfVar15->body,pfVar12->body,pfVar15->bodylen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
             );
      pfVar15 = rdoc;
      reverse_sequence_iterator_kvs_test()::__test_pass = '\x01';
      iVar4 = bcmp(rdoc->body,apfStack_4a8[lVar14]->body,rdoc->bodylen);
      if (iVar4 != 0) {
        __assert_fail("!memcmp(rdoc->body, doc2[i]->body, rdoc->bodylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xad5,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    fdb_doc_free(pfVar15);
    rdoc = (fdb_doc *)0x0;
    lVar14 = lVar14 + -1;
  }
  if ((int)lVar14 != -1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xadb);
    reverse_sequence_iterator_kvs_test()::__test_pass = 1;
    __assert_fail("count==n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xadb,"void reverse_sequence_iterator_kvs_test()");
  }
  fdb_iterator_close(iterator2);
  iVar4 = 0;
  fVar3 = fdb_iterator_sequence_init(kv1,&iterator,0,0,0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    iVar5 = 10;
    while( true ) {
      fVar3 = fdb_iterator_get(iterator,&rdoc);
      pfVar15 = rdoc;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xae5);
        reverse_sequence_iterator_kvs_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xae5,"void reverse_sequence_iterator_kvs_test()");
      }
      pvVar1 = rdoc->key;
      pfVar12 = local_4f8[iVar4];
      pvVar2 = pfVar12->key;
      iVar6 = bcmp(pvVar1,pvVar2,rdoc->keylen);
      if (iVar6 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xae6);
        reverse_sequence_iterator_kvs_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xae6,"void reverse_sequence_iterator_kvs_test()");
      }
      pvVar1 = pfVar15->meta;
      pvVar2 = pfVar12->meta;
      iVar6 = bcmp(pvVar1,pvVar2,pfVar15->metalen);
      if (iVar6 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xae7);
        reverse_sequence_iterator_kvs_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xae7,"void reverse_sequence_iterator_kvs_test()");
      }
      pvVar1 = pfVar15->body;
      pvVar2 = pfVar12->body;
      iVar6 = bcmp(pvVar1,pvVar2,pfVar15->bodylen);
      if (iVar6 != 0) break;
      fdb_doc_free(pfVar15);
      rdoc = (fdb_doc *)0x0;
      bVar17 = iVar4 == 8;
      iVar4 = iVar4 + 2;
      if (bVar17) {
        iVar4 = 1;
      }
      fVar3 = fdb_iterator_next(iterator);
      iVar5 = iVar5 + -1;
      if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
        if (iVar5 == 0) {
          fdb_iterator_close(iterator);
          for (lVar14 = 0; lVar14 != 10; lVar14 = lVar14 + 1) {
            fdb_doc_free(local_4f8[lVar14]);
            fdb_doc_free(apfStack_4a8[lVar14]);
          }
          fdb_kvs_close(kv1);
          fdb_kvs_close(kv2);
          fdb_close(dbfile);
          fdb_shutdown();
          memleak_end();
          __format = "%s PASSED\n";
          if (reverse_sequence_iterator_kvs_test()::__test_pass != '\0') {
            __format = "%s FAILED\n";
          }
          fprintf(_stderr,__format,"reverse sequence iterator kvs test");
          return;
        }
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xaf6);
        reverse_sequence_iterator_kvs_test()::__test_pass = 1;
        __assert_fail("count==n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xaf6,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xae8);
    reverse_sequence_iterator_kvs_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xae8,"void reverse_sequence_iterator_kvs_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0xae2);
  reverse_sequence_iterator_kvs_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xae2,"void reverse_sequence_iterator_kvs_test()");
}

Assistant:

void reverse_sequence_iterator_kvs_test()
{
    TEST_INIT();
    memleak_start();

    int i, r, count;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *kv1, *kv2;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc **doc2 = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;
    fdb_iterator *iterator2;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &kv1, &kvs_config);
    status = fdb_set_log_callback(kv1, logCallbackFunc,
                                  (void *) "reverse_sequence_iterator_kvs_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create another KV store...
    status = fdb_kvs_open(dbfile, &kv2, "kv2", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // to 'kv2' with entire range
    for (i=0;i<n;++i) {
        sprintf(keybuf, "kEy%d", i);
        sprintf(metabuf, "mEta%d", i);
        sprintf(bodybuf, "bOdy%d", i);
        fdb_doc_create(&doc2[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(kv2, doc2[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // insert kv1 documents of even number
    for (i=0;i<n;i+=2) {
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(kv1, doc[i]);
    }

    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert kv1 documents of odd number
    for (i=1;i<n;i+=2) {
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(kv1, doc[i]);
    }
    // commit without WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // iterate even docs on kv1
    status = fdb_iterator_sequence_init(kv1, &iterator, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=0;
    count = 0;
    while (1) {
        fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(!memcmp(rdoc->key, doc[i]->key, rdoc->keylen));
        TEST_CHK(!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen));
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
        if (i + 2 >= n) {
            break;
        }
        i = i + 2; // by-seq, first come even docs, then odd
        status = fdb_iterator_next(iterator);
        if (status == FDB_RESULT_ITERATOR_FAIL) break;
    }
    TEST_CHK(count==n/2);

    // iterate all docs over kv2
    status = fdb_iterator_sequence_init(kv2, &iterator2, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    while(1) {
        status = fdb_iterator_get(iterator2, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        status = fdb_iterator_next(iterator2);
        if (status == FDB_RESULT_ITERATOR_FAIL) {
            break;
        }
    }

    // manually flush WAL & commit
    // iterators should be unaffected
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // reverse iterate even docs over kv1
     i = n - 4;
    count = 0;
    while (1) {
        status = fdb_iterator_prev(iterator);
        if (status == FDB_RESULT_ITERATOR_FAIL) {
            break;
        }
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->key, doc[i]->key, rdoc->keylen));
        TEST_CHK(!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen));
        fdb_doc_free(rdoc);
        rdoc = NULL;
        i-=2;
        count++;
    }

    TEST_CHK(count==4);
    fdb_iterator_close(iterator);

    i = n-1;
    count = 0;
    // reverse iterate all docs over kv2
    while (1) {
        status = fdb_iterator_prev(iterator2);
        if (status == FDB_RESULT_ITERATOR_FAIL) {
            break;
        }
        status = fdb_iterator_get(iterator2, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->key, doc2[i]->key, rdoc->keylen));
        TEST_CHK(!memcmp(rdoc->meta, doc2[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc2[i]->body, rdoc->bodylen));
        fdb_doc_free(rdoc);
        rdoc = NULL;
        i--;
        count++;
    }
    TEST_CHK(count==n);
    fdb_iterator_close(iterator2);

    // re-open iterator after commit should return all docs for kv1
    i = 0;
    count = 0;
    status = fdb_iterator_sequence_init(kv1, &iterator, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    while (1) {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        if (i == 8) {
            i=1; // switch to odds
        } else {
            i+=2;
        }
        count++;
        status = fdb_iterator_next(iterator);
        if (status == FDB_RESULT_ITERATOR_FAIL) {
            break;
        }
    }
    TEST_CHK(count==n);
    fdb_iterator_close(iterator);

    // free all documents
    for (i=0;i<n;++i) {
        fdb_doc_free(doc[i]);
        fdb_doc_free(doc2[i]);
    }

    fdb_kvs_close(kv1);
    fdb_kvs_close(kv2);
    fdb_close(dbfile);

    fdb_shutdown();
    memleak_end();
    TEST_RESULT("reverse sequence iterator kvs test");

}